

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportSubroutinePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortListSyntax,slang::syntax::ModportSubroutinePortListSyntax_const&>
          (BumpAllocator *this,ModportSubroutinePortListSyntax *args)

{
  ModportSubroutinePortListSyntax *this_00;
  
  this_00 = (ModportSubroutinePortListSyntax *)allocate(this,0x98,8);
  slang::syntax::ModportSubroutinePortListSyntax::ModportSubroutinePortListSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }